

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_object.c
# Opt level: O1

void assert_print_object(char *expected,char *input)

{
  cJSON_bool cVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  parse_buffer parsebuffer;
  printbuffer unformatted_buffer;
  printbuffer formatted_buffer;
  cJSON item [1];
  uchar printed_formatted [1024];
  uchar printed_unformatted [1024];
  parse_buffer local_928;
  printbuffer local_8e8;
  printbuffer local_8a8;
  cJSON local_868;
  uchar local_828 [1024];
  uchar local_428 [1024];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_8a8.hooks.deallocate = (_func_void_void_ptr *)0x0;
  local_8a8.hooks.reallocate = (_func_void_ptr_void_ptr_size_t *)0x0;
  local_8a8.noalloc = 0;
  local_8a8.format = 0;
  local_8a8.hooks.allocate = (_func_void_ptr_size_t *)0x0;
  local_8a8.offset = 0;
  local_8a8.depth = 0;
  local_8a8.buffer = (uchar *)0x0;
  local_8a8.length = 0;
  local_8e8.hooks.deallocate = (_func_void_void_ptr *)0x0;
  local_8e8.hooks.reallocate = (_func_void_ptr_void_ptr_size_t *)0x0;
  local_8e8.noalloc = 0;
  local_8e8.format = 0;
  local_8e8.hooks.allocate = (_func_void_ptr_size_t *)0x0;
  local_8e8.offset = 0;
  local_8e8.depth = 0;
  local_8e8.buffer = (uchar *)0x0;
  local_8e8.length = 0;
  local_928.length = 0;
  local_928.hooks.reallocate = (_func_void_ptr_void_ptr_size_t *)0x0;
  local_928.hooks.allocate = (_func_void_ptr_size_t *)0x0;
  local_928.hooks.deallocate = (_func_void_void_ptr *)0x0;
  local_928.offset = 0;
  local_928.depth = 0;
  local_928.content = (uchar *)input;
  sVar2 = strlen(input);
  local_928.length = sVar2 + 1;
  local_928.hooks.allocate = global_hooks.allocate;
  local_928.hooks.deallocate = global_hooks.deallocate;
  local_928.hooks.reallocate = global_hooks.reallocate;
  local_8a8.buffer = local_828;
  local_8a8.length = 0x400;
  local_8a8.offset = 0;
  local_8a8.noalloc = 1;
  local_8a8.hooks.allocate = global_hooks.allocate;
  local_8a8.hooks.deallocate = global_hooks.deallocate;
  local_8a8.hooks.reallocate = global_hooks.reallocate;
  local_8e8.buffer = local_428;
  local_8e8.length = 0x400;
  local_8e8.offset = 0;
  local_8e8.noalloc = 1;
  local_8e8.hooks.allocate = global_hooks.allocate;
  local_8e8.hooks.deallocate = global_hooks.deallocate;
  local_8e8.hooks.reallocate = global_hooks.reallocate;
  local_868.valuedouble = 0.0;
  local_868.string = (char *)0x0;
  local_868.valuestring = (char *)0x0;
  local_868.valueint = 0;
  local_868._44_4_ = 0;
  local_868.child = (cJSON *)0x0;
  local_868.type = 0;
  local_868._28_4_ = 0;
  local_868.next = (cJSON *)0x0;
  local_868.prev = (cJSON *)0x0;
  cVar1 = parse_object(&local_868,&local_928);
  if (cVar1 == 0) {
    UnityFail("Failed to parse object.",0x3a);
  }
  local_8e8._32_8_ = local_8e8._32_8_ & 0xffffffff;
  cVar1 = print_object(&local_868,&local_8e8);
  if (cVar1 == 0) {
    UnityFail("Failed to print unformatted string.",0x3d);
  }
  UnityAssertEqualString(input,(char *)local_428,"Unformatted object is not correct.",0x3e);
  local_8a8.format = 1;
  cVar1 = print_object(&local_868,&local_8a8);
  if (cVar1 == 0) {
    UnityFail("Failed to print formatted string.",0x41);
  }
  UnityAssertEqualString(expected,(char *)local_828,"Formatted ojbect is not correct.",0x42);
  reset(&local_868);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void assert_print_object(const char * const expected, const char * const input)
{
    unsigned char printed_unformatted[1024];
    unsigned char printed_formatted[1024];

    cJSON item[1];

    printbuffer formatted_buffer = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };
    printbuffer unformatted_buffer = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };
    parse_buffer parsebuffer = { 0, 0, 0, 0, { 0, 0, 0 } };

    /* buffer for parsing */
    parsebuffer.content = (const unsigned char*)input;
    parsebuffer.length = strlen(input) + sizeof("");
    parsebuffer.hooks = global_hooks;

    /* buffer for formatted printing */
    formatted_buffer.buffer = printed_formatted;
    formatted_buffer.length = sizeof(printed_formatted);
    formatted_buffer.offset = 0;
    formatted_buffer.noalloc = true;
    formatted_buffer.hooks = global_hooks;

    /* buffer for unformatted printing */
    unformatted_buffer.buffer = printed_unformatted;
    unformatted_buffer.length = sizeof(printed_unformatted);
    unformatted_buffer.offset = 0;
    unformatted_buffer.noalloc = true;
    unformatted_buffer.hooks = global_hooks;

    memset(item, 0, sizeof(item));
    TEST_ASSERT_TRUE_MESSAGE(parse_object(item, &parsebuffer), "Failed to parse object.");

    unformatted_buffer.format = false;
    TEST_ASSERT_TRUE_MESSAGE(print_object(item, &unformatted_buffer), "Failed to print unformatted string.");
    TEST_ASSERT_EQUAL_STRING_MESSAGE(input, printed_unformatted, "Unformatted object is not correct.");

    formatted_buffer.format = true;
    TEST_ASSERT_TRUE_MESSAGE(print_object(item, &formatted_buffer), "Failed to print formatted string.");
    TEST_ASSERT_EQUAL_STRING_MESSAGE(expected, printed_formatted, "Formatted ojbect is not correct.");

    reset(item);
}